

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Variation *variation)

{
  variation_type_t vVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  string *psVar5;
  Variation *in_RSI;
  ostream *in_RDI;
  Variation *in_stack_ffffffffffffff68;
  string local_30 [32];
  Variation *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  Variation::getChromosome_abi_cxx11_(in_stack_ffffffffffffff68);
  poVar2 = std::operator<<(in_RDI,local_30);
  poVar2 = std::operator<<(poVar2," ");
  sVar3 = Variation::getCoordinate1(local_10);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string(local_30);
  vVar1 = Variation::getType(local_10);
  poVar2 = local_8;
  if (vVar1 == INSERTION) {
    sVar3 = Variation::getCoordinate2(local_10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2," INS");
    Variation::getSequence_abi_cxx11_(local_10);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      poVar2 = std::operator<<(local_8," ");
      psVar5 = Variation::getSequence_abi_cxx11_(local_10);
      std::operator<<(poVar2,(string *)psVar5);
    }
  }
  else if (vVar1 == DELETION) {
    sVar3 = Variation::getCoordinate2(local_10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3 - 1);
    std::operator<<(poVar2," DEL");
  }
  else {
    sVar3 = Variation::getCoordinate2(local_10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::operator<<(poVar2," NONE");
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Variation& variation) {
	os << variation.getChromosome() << " " << variation.getCoordinate1() << " ";
	switch (variation.getType()) {
	case Variation::INSERTION:
		os << variation.getCoordinate2() << " INS";
		if (variation.getSequence().size() > 0) {
			os << " " << variation.getSequence();
		}
		break;
	case Variation::DELETION:
		os << (variation.getCoordinate2()-1) << " DEL";
		break;
	default:
		os << variation.getCoordinate2() << " NONE";
		break;
	}
	return os;
}